

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O1

int msg_write(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    sVar1 = write(fd,(void *)((long)buf + uVar3),count - uVar3);
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0xb) goto LAB_00107654;
      usleep(50000);
    }
    else {
      if (sVar1 == 0) {
        perror("write");
      }
LAB_00107654:
      uVar3 = uVar3 + sVar1;
    }
    if (count <= uVar3) {
      return (int)uVar3;
    }
  } while( true );
}

Assistant:

static int msg_write(int fd, void *buf, size_t count)
{
    ssize_t bytes;
    size_t total = 0;

    do {
#ifdef _WIN32
        bytes = send(fd, (uint8_t *)buf + total, count - total, 0);
#else
        bytes = write(fd, (uint8_t *)buf + total, count - total);
#endif
        if (bytes == -1) {
            if (errno == EAGAIN) {
                /*
                 * This could happen, since this function goal is not to
                 * return until all data have been read, just sleep a little
                 * bit (0.05 seconds)
                 */

#ifdef _WIN32
                Sleep(5);
#else
                usleep(50000);
#endif
                continue;
            }
        }
        else if (bytes == 0) {
            /* Broken pipe ? */
            perror("write");
            return -1;
        }
        total += bytes;

    } while (total < count);

    return total;
}